

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

const_varint_iterator<long> __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this,int param_1)

{
  const_varint_iterator<long> cVar1;
  assert_error *this_00;
  int param_1_local;
  const_varint_iterator<long> *this_local;
  const_varint_iterator<long> tmp;
  
  if (this->m_data == (char *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
  }
  cVar1 = *this;
  operator++(this);
  return cVar1;
}

Assistant:

const_varint_iterator operator++(int) {
        protozero_assert(m_data);
        const const_varint_iterator tmp{*this};
        ++(*this);
        return tmp;
    }